

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O1

BIGNUM * asn1_string_to_bn(ASN1_STRING *ai,BIGNUM *bn,int type)

{
  BIGNUM *b;
  int reason;
  int line;
  
  if ((ai->type & 0xfffffeffU) == type) {
    b = BN_bin2bn(ai->data,ai->length,(BIGNUM *)bn);
    if (b != (BIGNUM *)0x0) {
      if ((ai->type & 0x100) == 0) {
        return (BIGNUM *)b;
      }
      BN_set_negative(b,1);
      return (BIGNUM *)b;
    }
    reason = 0x69;
    line = 0x1aa;
  }
  else {
    reason = 0xc3;
    line = 0x1a4;
  }
  ERR_put_error(0xc,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                ,line);
  return (BIGNUM *)0x0;
}

Assistant:

static BIGNUM *asn1_string_to_bn(const ASN1_STRING *ai, BIGNUM *bn, int type) {
  if ((ai->type & ~V_ASN1_NEG) != type) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_INTEGER_TYPE);
    return NULL;
  }

  BIGNUM *ret;
  if ((ret = BN_bin2bn(ai->data, ai->length, bn)) == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BN_LIB);
  } else if (ai->type & V_ASN1_NEG) {
    BN_set_negative(ret, 1);
  }
  return ret;
}